

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree.hpp
# Opt level: O0

void __thiscall
Indexing::SubstitutionTree<Indexing::LiteralClause>::
Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>
::~Iterator(Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>
            *this)

{
  Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>
  *in_RDI;
  
  reset(in_RDI);
  Lib::Stack<Lib::BacktrackData>::~Stack((Stack<Lib::BacktrackData> *)in_RDI);
  Lib::Stack<Lib::VirtualIterator<Indexing::SubstitutionTree<Indexing::LiteralClause>::Node_**>_>::
  ~Stack((Stack<Lib::VirtualIterator<Indexing::SubstitutionTree<Indexing::LiteralClause>::Node_**>_>
          *)in_RDI);
  Lib::Option<Lib::VirtualIterator<Indexing::LiteralClause_*>_>::~Option
            ((Option<Lib::VirtualIterator<Indexing::LiteralClause_*>_> *)0x3239bd);
  Lib::Stack<unsigned_int>::~Stack((Stack<unsigned_int> *)in_RDI);
  RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>::
  ~RobUnification((RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_> *)0x3239d8);
  return;
}

Assistant:

~Iterator()
      { reset(); }